

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_finish_block
               (libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
               u32 block_length,deflate_sequence *sequences,_Bool is_final_block)

{
  long in_RDI;
  undefined1 in_R9B;
  _Bool in_stack_000000df;
  deflate_sequence *in_stack_000000e0;
  u32 in_stack_000000ec;
  u8 *in_stack_000000f0;
  deflate_output_bitstream *in_stack_000000f8;
  libdeflate_compressor *in_stack_00000100;
  deflate_codes *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  *(int *)(in_RDI + 0x428) = *(int *)(in_RDI + 0x428) + 1;
  deflate_make_huffman_codes
            ((deflate_freqs *)(CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffc8);
  deflate_flush_block(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,
                      in_stack_000000e0,in_stack_000000df);
  return;
}

Assistant:

static void
deflate_finish_block(struct libdeflate_compressor *c,
		     struct deflate_output_bitstream *os,
		     const u8 *block_begin, u32 block_length,
		     const struct deflate_sequence *sequences,
		     bool is_final_block)
{
	c->freqs.litlen[DEFLATE_END_OF_BLOCK]++;
	deflate_make_huffman_codes(&c->freqs, &c->codes);
	deflate_flush_block(c, os, block_begin, block_length, sequences,
			    is_final_block);
}